

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_digest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  string err;
  char current_char;
  uint i_1;
  long firstSequenceLength;
  char automatonState;
  StringBuffer pattern;
  anon_class_16_2_6a24d160 process_motif;
  char complement_chars [255];
  int i;
  args_t args;
  args_t *in_stack_fffffffffffffe20;
  char in_stack_fffffffffffffe2f;
  StringBuffer *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  args_t *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe57;
  uint local_184;
  StringBuffer *pattern_00;
  anon_class_16_2_6a24d160 *this;
  int local_40;
  char *local_20;
  
  argparse::args_t::args_t
            (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
             &in_stack_fffffffffffffe30->sData);
  initAlphabets((bool)in_stack_fffffffffffffe57,in_stack_fffffffffffffe48,
                SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
  for (local_40 = 0; local_40 < 0x100; local_40 = local_40 + 1) {
    allowed_chars[local_40] = -1;
  }
  allowed_chars[0x41] = 0;
  allowed_chars[0x43] = 1;
  allowed_chars[0x47] = 2;
  allowed_chars[0x54] = 3;
  this = (anon_class_16_2_6a24d160 *)0x0;
  pattern_00 = (StringBuffer *)0x4100000000;
  StringBuffer::StringBuffer((StringBuffer *)in_stack_fffffffffffffe20);
  bVar1 = false;
  sVar3 = strlen(local_20);
  for (local_184 = 0; (long)(ulong)local_184 < (long)sVar3; local_184 = local_184 + 1) {
    iVar2 = toupper((int)local_20[local_184]);
    if (allowed_chars[(char)iVar2] < 0) {
      if (bVar1) {
        main::anon_class_16_2_6a24d160::operator()(this,pattern_00);
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      StringBuffer::appendChar(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2f);
    }
  }
  if (bVar1) {
    main::anon_class_16_2_6a24d160::operator()(this,pattern_00);
  }
  StringBuffer::~StringBuffer((StringBuffer *)0x104b3d);
  argparse::args_t::~args_t(in_stack_fffffffffffffe20);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
    args_t args = args_t(argc, argv);
    
    initAlphabets(false, NULL, true);
    
    
    for (int i = 0; i < 256; i++) {
        allowed_chars[i] = -1;
    }
    
    allowed_chars['A'] = 0;
    allowed_chars['C'] = 1;
    allowed_chars['G'] = 2;
    allowed_chars['T'] = 3;
    
    char complement_chars[255] = {0};
    complement_chars['A'] = 'T';
    complement_chars['T'] = 'A';
    complement_chars['C'] = 'G';
    complement_chars['G'] = 'C';


    auto process_motif = [&] (StringBuffer& pattern) -> void {
        int L = pattern.length();
        if (L >= 4 && L <= 16) {
            cout << pattern.getString () << endl;
            if (!patterns[L]) {
                patterns[L] = new Vector;
            }
            patterns[L]->appendValue(patternToCode (pattern));
            
            if (args.rc == complement) {
                StringBuffer rc;
                for (int i = L-1; i>=0; i--) {
                    rc.appendChar (complement_chars[pattern.getChar (i)]);
                }
                patterns[L]->appendValue(patternToCode (rc));
            }
            
            pattern.resetString ();
        } else {
            throw (std::string ("Motif '") + std::string (pattern.getString()) + "' is not 4-16 nucleotides in length");
        }
    };
    
    try {
        // parse the patterns
        StringBuffer pattern;
        char automatonState = 0;
        long firstSequenceLength = strlen (args.motif_list);
 
        for (unsigned i = 0; i < firstSequenceLength; i++) {
            char current_char = toupper (args.motif_list[i]);
            if (allowed_chars [current_char] >= 0) {
                automatonState = 1;
                pattern.appendChar (current_char);
            } else {
                if (automatonState == 1) {
                    process_motif (pattern);
                }
                automatonState = 0;
            }
        }
        
        if (automatonState == 1) {
            process_motif (pattern);
        }

        return 1;
        automatonState = 0;
        while (long state = readFASTA(args.input, automatonState, names, sequences, nameLengths,
                                      seqLengths, firstSequenceLength, true)) { // read sequences one by one
            
            firstSequenceLength = 0L;
        }

    } catch (const std::string err) {
        cerr << "ERROR: " << err << endl;
        return 1;
    }
    
    return 0;
}